

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_get(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQVM *this;
  SQObjectPtr *obj;
  SQObjectPtr *self;
  SQInteger in_stack_00000020;
  SQUnsignedInteger in_stack_00000028;
  SQObjectPtr *in_stack_00000030;
  SQObjectPtr *in_stack_00000038;
  SQObjectPtr *in_stack_00000040;
  SQVM *in_stack_00000048;
  SQInteger in_stack_ffffffffffffffd8;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  this = (SQVM *)stack_get(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SQVM::GetUp(this,in_stack_ffffffffffffffd8);
  bVar1 = SQVM::Get(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030,
                    in_stack_00000028,in_stack_00000020);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    SQVM::Pop((SQVM *)0x117f54);
    local_8 = -1;
  }
  return local_8;
}

Assistant:

SQRESULT sq_get(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self=stack_get(v,idx);
    SQObjectPtr &obj = v->GetUp(-1);
    if(v->Get(self,obj,obj,false,DONT_FALL_BACK))
        return SQ_OK;
    v->Pop();
    return SQ_ERROR;
}